

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_cfgable.c
# Opt level: O3

void config_free(OperationConfig *config)

{
  OperationConfig *pOVar1;
  getout *pgVar2;
  getout *__ptr;
  OperationConfig *last;
  
  if (config != (OperationConfig *)0x0) {
    do {
      pOVar1 = config->prev;
      free(config->useragent);
      config->useragent = (char *)0x0;
      free(config->altsvc);
      config->altsvc = (char *)0x0;
      free(config->hsts);
      config->hsts = (char *)0x0;
      free(config->haproxy_clientip);
      config->haproxy_clientip = (char *)0x0;
      curl_slist_free_all(config->cookies);
      free(config->cookiejar);
      config->cookiejar = (char *)0x0;
      curl_slist_free_all(config->cookiefiles);
      curlx_dyn_free(&config->postdata);
      free(config->query);
      config->query = (char *)0x0;
      free(config->referer);
      config->referer = (char *)0x0;
      free(config->headerfile);
      config->headerfile = (char *)0x0;
      free(config->ftpport);
      config->ftpport = (char *)0x0;
      free(config->iface);
      config->iface = (char *)0x0;
      free(config->range);
      config->range = (char *)0x0;
      free(config->userpwd);
      config->userpwd = (char *)0x0;
      free(config->tls_username);
      config->tls_username = (char *)0x0;
      free(config->tls_password);
      config->tls_password = (char *)0x0;
      free(config->tls_authtype);
      config->tls_authtype = (char *)0x0;
      free(config->proxy_tls_username);
      config->proxy_tls_username = (char *)0x0;
      free(config->proxy_tls_password);
      config->proxy_tls_password = (char *)0x0;
      free(config->proxy_tls_authtype);
      config->proxy_tls_authtype = (char *)0x0;
      free(config->proxyuserpwd);
      config->proxyuserpwd = (char *)0x0;
      free(config->proxy);
      config->proxy = (char *)0x0;
      free(config->dns_ipv6_addr);
      config->dns_ipv6_addr = (char *)0x0;
      free(config->dns_ipv4_addr);
      config->dns_ipv4_addr = (char *)0x0;
      free(config->dns_interface);
      config->dns_interface = (char *)0x0;
      free(config->dns_servers);
      config->dns_servers = (char *)0x0;
      free(config->noproxy);
      config->noproxy = (char *)0x0;
      free(config->mail_from);
      config->mail_from = (char *)0x0;
      curl_slist_free_all(config->mail_rcpt);
      free(config->mail_auth);
      config->mail_auth = (char *)0x0;
      free(config->netrc_file);
      config->netrc_file = (char *)0x0;
      free(config->output_dir);
      config->output_dir = (char *)0x0;
      free(config->proto_str);
      config->proto_str = (char *)0x0;
      free(config->proto_redir_str);
      config->proto_redir_str = (char *)0x0;
      __ptr = config->url_list;
      while (__ptr != (getout *)0x0) {
        pgVar2 = __ptr->next;
        free(__ptr->url);
        __ptr->url = (char *)0x0;
        free(__ptr->outfile);
        __ptr->outfile = (char *)0x0;
        free(__ptr->infile);
        free(__ptr);
        __ptr = pgVar2;
      }
      config->url_get = (getout *)0x0;
      config->url_out = (getout *)0x0;
      config->url_list = (getout *)0x0;
      config->url_last = (getout *)0x0;
      free(config->ipfs_gateway);
      config->ipfs_gateway = (char *)0x0;
      free(config->doh_url);
      config->doh_url = (char *)0x0;
      free(config->cipher_list);
      config->cipher_list = (char *)0x0;
      free(config->proxy_cipher_list);
      config->proxy_cipher_list = (char *)0x0;
      free(config->cipher13_list);
      config->cipher13_list = (char *)0x0;
      free(config->proxy_cipher13_list);
      config->proxy_cipher13_list = (char *)0x0;
      free(config->cert);
      config->cert = (char *)0x0;
      free(config->proxy_cert);
      config->proxy_cert = (char *)0x0;
      free(config->cert_type);
      config->cert_type = (char *)0x0;
      free(config->proxy_cert_type);
      config->proxy_cert_type = (char *)0x0;
      free(config->cacert);
      config->cacert = (char *)0x0;
      free(config->login_options);
      config->login_options = (char *)0x0;
      free(config->proxy_cacert);
      config->proxy_cacert = (char *)0x0;
      free(config->capath);
      config->capath = (char *)0x0;
      free(config->proxy_capath);
      config->proxy_capath = (char *)0x0;
      free(config->crlfile);
      config->crlfile = (char *)0x0;
      free(config->pinnedpubkey);
      config->pinnedpubkey = (char *)0x0;
      free(config->proxy_pinnedpubkey);
      config->proxy_pinnedpubkey = (char *)0x0;
      free(config->proxy_crlfile);
      config->proxy_crlfile = (char *)0x0;
      free(config->key);
      config->key = (char *)0x0;
      free(config->proxy_key);
      config->proxy_key = (char *)0x0;
      free(config->key_type);
      config->key_type = (char *)0x0;
      free(config->proxy_key_type);
      config->proxy_key_type = (char *)0x0;
      free(config->key_passwd);
      config->key_passwd = (char *)0x0;
      free(config->proxy_key_passwd);
      config->proxy_key_passwd = (char *)0x0;
      free(config->pubkey);
      config->pubkey = (char *)0x0;
      free(config->hostpubmd5);
      config->hostpubmd5 = (char *)0x0;
      free(config->hostpubsha256);
      config->hostpubsha256 = (char *)0x0;
      free(config->engine);
      config->engine = (char *)0x0;
      free(config->etag_save_file);
      config->etag_save_file = (char *)0x0;
      free(config->etag_compare_file);
      config->etag_compare_file = (char *)0x0;
      free(config->ssl_ec_curves);
      config->ssl_ec_curves = (char *)0x0;
      free(config->request_target);
      config->request_target = (char *)0x0;
      free(config->customrequest);
      config->customrequest = (char *)0x0;
      free(config->krblevel);
      config->krblevel = (char *)0x0;
      free(config->oauth_bearer);
      config->oauth_bearer = (char *)0x0;
      free(config->sasl_authzid);
      config->sasl_authzid = (char *)0x0;
      free(config->unix_socket_path);
      config->unix_socket_path = (char *)0x0;
      free(config->writeout);
      config->writeout = (char *)0x0;
      free(config->proto_default);
      config->proto_default = (char *)0x0;
      curl_slist_free_all(config->quote);
      curl_slist_free_all(config->postquote);
      curl_slist_free_all(config->prequote);
      curl_slist_free_all(config->headers);
      curl_slist_free_all(config->proxyheaders);
      curl_mime_free(config->mimepost);
      config->mimepost = (curl_mime *)0x0;
      tool_mime_free(config->mimeroot);
      config->mimeroot = (tool_mime *)0x0;
      config->mimecurrent = (tool_mime *)0x0;
      curl_slist_free_all(config->telnet_options);
      curl_slist_free_all(config->resolve);
      curl_slist_free_all(config->connect_to);
      free(config->preproxy);
      config->preproxy = (char *)0x0;
      free(config->proxy_service_name);
      config->proxy_service_name = (char *)0x0;
      free(config->service_name);
      config->service_name = (char *)0x0;
      free(config->ftp_account);
      config->ftp_account = (char *)0x0;
      free(config->ftp_alternative_to_user);
      config->ftp_alternative_to_user = (char *)0x0;
      free(config->aws_sigv4);
      config->aws_sigv4 = (char *)0x0;
      free(config->proto_str);
      config->proto_str = (char *)0x0;
      free(config->proto_redir_str);
      config->proto_redir_str = (char *)0x0;
      free(config->ech);
      config->ech = (char *)0x0;
      free(config->ech_config);
      config->ech_config = (char *)0x0;
      free(config->ech_public);
      free(config);
      config = pOVar1;
    } while (pOVar1 != (OperationConfig *)0x0);
  }
  return;
}

Assistant:

void config_free(struct OperationConfig *config)
{
  struct OperationConfig *last = config;

  /* Free each of the structures in reverse order */
  while(last) {
    struct OperationConfig *prev = last->prev;

    free_config_fields(last);
    free(last);

    last = prev;
  }
}